

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void do_cmd_sell_stat(command *cmd)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  wchar_t points_left_local;
  wchar_t choice;
  uint local_c;
  
  if (rolled_stats == '\0') {
    cmd_get_arg_choice((command_conflict *)cmd,"choice",(int *)&local_c);
    uVar3 = (ulong)local_c;
    if (uVar3 < 5) {
      iVar1 = stats[uVar3];
      if (10 < (long)iVar1) {
        iVar2 = birth_stat_costs[iVar1];
        stats[uVar3] = iVar1 + -1;
        points_spent[uVar3] = points_spent[uVar3] - iVar2;
        points_left_local = L'\x002e2a10';
        points_inc[uVar3] = iVar2;
        points_left = iVar2 + points_left;
        event_signal_birthpoints(points_spent,points_inc,points_left);
        recalculate_stats((int *)(ulong)(uint)points_left,points_left_local);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_sell_stat(struct command *cmd)
{
	/* .choice is the stat to sell */
	if (!rolled_stats) {
		int choice;
		cmd_get_arg_choice(cmd, "choice", &choice);
		sell_stat(choice, stats, points_spent, points_inc,
			&points_left, true);
	}
}